

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

string * kwssys::SystemTools::UpperCase(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)s->_M_string_length);
  if (s->_M_string_length != 0) {
    uVar2 = 0;
    do {
      iVar1 = toupper((int)(s->_M_dataplus)._M_p[uVar2]);
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar2] = (char)iVar1;
      uVar2 = uVar2 + 1;
    } while (uVar2 < s->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::UpperCase(const std::string& s)
{
  std::string n;
  n.resize(s.size());
  for (size_t i = 0; i < s.size(); i++) {
    n[i] = static_cast<std::string::value_type>(toupper(s[i]));
  }
  return n;
}